

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O1

void __thiscall FIX::Initiator::stop(Initiator *this,bool force)

{
  Mutex *__mutex;
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex_00;
  bool bVar2;
  _Base_ptr p_Var3;
  Session *pSVar4;
  _Rb_tree_node_base *p_Var5;
  Session **ppSVar6;
  undefined7 in_register_00000031;
  char *__end;
  int iVar7;
  vector<FIX::Session_*,_std::allocator<FIX::Session_*>_> enabledSessions;
  Locker l;
  Session *pSession;
  SessionIDs connected;
  Session **local_b8;
  iterator iStack_b0;
  Session **local_a8;
  pthread_mutex_t *local_98;
  undefined4 local_8c;
  Session *local_88;
  string local_80;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_60;
  
  if (this->m_stop == false) {
    HttpServer::stopGlobal();
    local_a8 = (Session **)0x0;
    local_b8 = (Session **)0x0;
    iStack_b0._M_current = (Session **)0x0;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    __mutex = &this->m_mutex;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    Mutex::lock(__mutex);
    local_98 = (pthread_mutex_t *)__mutex;
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::operator=(&local_60,&(this->m_connected)._M_t);
    local_8c = (undefined4)CONCAT71(in_register_00000031,force);
    iVar7 = (this->m_mutex).m_count;
    (this->m_mutex).m_count = iVar7 + -1;
    if (iVar7 < 2) {
      (this->m_mutex).m_threadID = 0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_88 = Session::lookupSession((SessionID *)(p_Var3 + 1));
        if ((local_88 != (Session *)0x0) && ((local_88->m_state).m_enabled == true)) {
          if (iStack_b0._M_current == local_a8) {
            std::vector<FIX::Session*,std::allocator<FIX::Session*>>::
            _M_realloc_insert<FIX::Session*const&>
                      ((vector<FIX::Session*,std::allocator<FIX::Session*>> *)&local_b8,iStack_b0,
                       &local_88);
          }
          else {
            *iStack_b0._M_current = local_88;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
          pSVar4 = local_88;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
          (pSVar4->m_state).m_enabled = false;
          SessionState::logoutReason(&pSVar4->m_state,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    __mutex_00 = local_98;
    if ((char)local_8c == '\0') {
      iVar7 = 10;
      do {
        bVar2 = isLoggedOn(this);
        if (!bVar2) break;
        process_sleep(1.0);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    Mutex::lock((Mutex *)&__mutex_00->__data);
    for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      pSVar4 = Session::lookupSession((SessionID *)(p_Var5 + 1));
      setDisconnected(this,&pSVar4->m_sessionID);
    }
    iVar7 = (this->m_mutex).m_count;
    (this->m_mutex).m_count = iVar7 + -1;
    if (iVar7 < 2) {
      (this->m_mutex).m_threadID = 0;
      pthread_mutex_unlock(__mutex_00);
    }
    this->m_stop = true;
    (*this->_vptr_Initiator[6])(this);
    if (this->m_threadid != 0) {
      thread_join(this->m_threadid);
    }
    this->m_threadid = 0;
    for (ppSVar6 = local_b8; ppSVar6 != iStack_b0._M_current; ppSVar6 = ppSVar6 + 1) {
      Session::logon(*ppSVar6);
    }
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&local_60);
    if (local_b8 != (Session **)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
  }
  return;
}

Assistant:

void Initiator::stop( bool force )
{
  if( isStopped() ) return;

  HttpServer::stopGlobal();

  std::vector<Session*> enabledSessions;

  SessionIDs connected;

  {
    Locker l(m_mutex);
    connected = m_connected;
  }

  SessionIDs::iterator i = connected.begin();
  for ( ; i != connected.end(); ++i )
  {
    Session* pSession = Session::lookupSession(*i);
    if( pSession && pSession->isEnabled() )
    {
      enabledSessions.push_back( pSession );
      pSession->logout();
    }
  }

  if( !force )
  {
    for ( int second = 1; second <= 10 && isLoggedOn(); ++second )
      process_sleep( 1 );
  }

  {
    Locker l(m_mutex);
    for ( i = connected.begin(); i != connected.end(); ++i )
      setDisconnected( Session::lookupSession(*i)->getSessionID() );
  }

  m_stop = true;
  onStop();
  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;

  std::vector<Session*>::iterator session = enabledSessions.begin();
  for( ; session != enabledSessions.end(); ++session )
    (*session)->logon();
}